

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.hpp
# Opt level: O1

void vbytehuffzero::decode
               (uint8_t *in_ptr,size_t in_size_u8,uint32_t *out_ptr,size_t out_size_u32,uint8_t *buf
               )

{
  uint uVar1;
  ulong __n;
  ulong uVar2;
  uint *puVar3;
  ulong cSrcSize;
  long lVar4;
  uint8_t *__dest;
  
  uVar1 = *(uint *)in_ptr;
  puVar3 = (uint *)(in_ptr + 4);
  __n = (ulong)(uVar1 & 0x1ffff);
  __dest = buf;
  if (0x1ffff < (ulong)uVar1) {
    uVar2 = (ulong)(uVar1 >> 0x11);
    do {
      cSrcSize = (ulong)*puVar3;
      if (cSrcSize == 0xffffffff) {
        memcpy(__dest,puVar3 + 1,0x20000);
        lVar4 = 0x20004;
      }
      else {
        HUF_decompress(__dest,0x20000,puVar3 + 1,cSrcSize);
        lVar4 = cSrcSize + 4;
      }
      puVar3 = (uint *)((long)puVar3 + lVar4);
      __dest = __dest + 0x20000;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  if (__n != 0) {
    if ((ulong)*puVar3 == 0xffffffff) {
      memcpy(__dest,puVar3 + 1,__n);
    }
    else {
      HUF_decompress(__dest,__n,puVar3 + 1,(ulong)*puVar3);
    }
  }
  vbyte::decode(buf,(ulong)uVar1,out_ptr,out_size_u32,(uint8_t *)0x0);
  return;
}

Assistant:

static void decode(const uint8_t* in_ptr, size_t in_size_u8,
        uint32_t* out_ptr, size_t out_size_u32, uint8_t* buf = NULL)
    {
        auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_ptr);
        size_t vbyte_bytes = *in_ptr_u32;
        in_ptr += +sizeof(uint32_t);

        auto out_ptr_u8 = reinterpret_cast<uint8_t*>(buf);
        auto out_size = vbyte_bytes;
        auto num_blocks = out_size / HUF_BLOCKSIZE_MAX;
        auto last_size = out_size % HUF_BLOCKSIZE_MAX;
        auto dst_capacity = out_size_u32;
        for (size_t i = 0; i < num_blocks; i++) {
            auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_ptr);
            size_t compressed_size = *in_ptr_u32;
            if (compressed_size == 0xFFFFFFFF) { // not compressible just copy
                memcpy(out_ptr_u8, in_ptr + 4, HUF_BLOCKSIZE_MAX);
                in_ptr += HUF_BLOCKSIZE_MAX + 4;
            } else {
                HUF_decompress(
                    out_ptr_u8, HUF_BLOCKSIZE_MAX, in_ptr + 4, compressed_size);
                in_ptr += (compressed_size + 4);
            }
            out_ptr_u8 += HUF_BLOCKSIZE_MAX;
        }
        if (last_size) {
            auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_ptr);
            size_t compressed_size = *in_ptr_u32;
            if (compressed_size == 0xFFFFFFFF) { // not compressible just copy
                memcpy(out_ptr_u8, in_ptr + 4, last_size);
            } else {
                HUF_decompress(
                    out_ptr_u8, last_size, in_ptr + 4, compressed_size);
            }
        }
        vbyte::decode(buf, vbyte_bytes, out_ptr, out_size_u32);
    }